

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSizeInBytes,size_t inLen,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  int iVar1;
  uchar *puVar2;
  reference pvVar3;
  unsigned_short *puVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  unsigned_short *puVar8;
  long lVar9;
  size_t in_RCX;
  size_t in_RDX;
  unsigned_short *in_RSI;
  void *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  size_t n;
  PIZChannelData *cd_1;
  size_t i_2;
  int y;
  int j;
  PIZChannelData *cd;
  size_t i_1;
  size_t pixelSize;
  EXRChannelInfo *chan;
  size_t i;
  unsigned_short *tmpBufferEnd;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int length;
  unsigned_short maxValue;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  uchar *ptr;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  size_type in_stack_fffffffffffffe38;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffe40;
  size_type sVar10;
  allocator_type *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
  *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  int ny;
  undefined1 *puVar11;
  size_type local_118;
  int local_110;
  int local_10c;
  size_type local_100;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff18;
  ulong __n;
  undefined8 in_stack_ffffffffffffff20;
  int iVar13;
  reference pvVar12;
  char *in_stack_ffffffffffffff28;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_d0 [2];
  int local_98;
  unsigned_short local_94;
  undefined1 local_91 [29];
  undefined4 local_74;
  unsigned_short *local_70;
  ushort local_68;
  ushort local_66 [10];
  undefined1 local_51 [25];
  long local_38;
  int local_2c;
  size_t local_28;
  size_t local_20;
  unsigned_short *local_18;
  void *local_10;
  byte local_1;
  
  iVar13 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  if (in_RCX == in_RDX) {
    memcpy(in_RDI,in_RSI,in_RCX);
    local_1 = 1;
  }
  else {
    puVar8 = (unsigned_short *)local_51;
    local_38 = in_R9;
    local_2c = in_R8D;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a0da6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a0dcf);
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a0ddc);
    memset(puVar2,0,0x2000);
    local_70 = local_18;
    cpy2(local_66,local_18);
    cpy2(&local_68,local_70 + 1);
    local_70 = local_70 + 2;
    if (local_68 < 0x2000) {
      if (local_66[0] <= local_68) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_51 + 1),
                            0);
        memcpy(pvVar3 + (int)(uint)local_66[0],local_70,
               (long)(int)(((uint)local_68 - (uint)local_66[0]) + 1));
        local_70 = (unsigned_short *)
                   ((long)local_70 + (long)(int)(((uint)local_68 - (uint)local_66[0]) + 1));
      }
      puVar11 = local_91;
      std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x4a0f24);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (allocator_type *)in_stack_fffffffffffffe50);
      std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x4a0f4d);
      puVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x4a0f5f);
      memset(puVar4,0,0x20000);
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a0f7b);
      puVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x4a0f8d);
      local_94 = reverseLutFromBitmap(puVar2,puVar4);
      ny = CONCAT22(local_94,in_stack_fffffffffffffec4);
      cpy4(&local_98,(int *)local_70);
      local_70 = local_70 + 2;
      if (local_28 < (ulong)((long)local_70 + ((long)local_98 - (long)local_18))) {
        local_1 = 0;
        local_74 = 1;
      }
      else {
        std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x4a1083);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (allocator_type *)in_stack_fffffffffffffe50);
        std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x4a10a9);
        hufUncompress(in_stack_ffffffffffffff28,iVar13,in_stack_ffffffffffffff18);
        std::allocator<tinyexr::PIZChannelData>::allocator
                  ((allocator<tinyexr::PIZChannelData> *)0x4a10e6);
        std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (allocator_type *)in_stack_fffffffffffffe50);
        std::allocator<tinyexr::PIZChannelData>::~allocator
                  ((allocator<tinyexr::PIZChannelData> *)0x4a110c);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                           (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        for (__n = 0; __n < (ulong)(long)local_2c; __n = __n + 1) {
          iVar13 = 2;
          if (*(int *)(local_38 + __n * 0x110 + 0x100) == 1) {
            iVar13 = 1;
          }
          pvVar12 = pvVar5;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          pvVar6->start = pvVar5;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          puVar4 = pvVar6->start;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          pvVar6->end = puVar4;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          iVar1 = in_stack_00000010;
          pvVar6->nx = in_stack_00000008;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          pvVar6->ny = iVar1;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          pvVar6->size = iVar13;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          iVar13 = pvVar6->nx;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          iVar1 = pvVar6->ny;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,__n);
          pvVar5 = pvVar12 + iVar13 * iVar1 * pvVar6->size;
        }
        local_100 = 0;
        while( true ) {
          sVar10 = local_100;
          sVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                  size(local_d0);
          if (sVar7 <= sVar10) break;
          pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                   operator[](local_d0,local_100);
          for (local_10c = 0; local_10c < pvVar6->size; local_10c = local_10c + 1) {
            wav2Decode(puVar8,(int)((ulong)puVar11 >> 0x20),(int)puVar11,ny,
                       in_stack_fffffffffffffec0,(unsigned_short)((ulong)puVar2 >> 0x30));
          }
          local_100 = local_100 + 1;
        }
        puVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x4a1486);
        in_stack_fffffffffffffe50 =
             (allocator_type *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                       (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        applyLut(puVar8,(unsigned_short *)in_stack_fffffffffffffe50,(int)(local_20 >> 1));
        for (local_110 = 0; local_110 < in_stack_00000010; local_110 = local_110 + 1) {
          local_118 = 0;
          while( true ) {
            sVar10 = local_118;
            sVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                    size(local_d0);
            if (sVar7 <= sVar10) break;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[](local_d0,local_118);
            lVar9 = (long)(pvVar6->nx * pvVar6->size);
            memcpy(local_10,pvVar6->end,lVar9 << 1);
            local_10 = (void *)(lVar9 * 2 + (long)local_10);
            pvVar6->end = pvVar6->end + lVar9;
            local_118 = local_118 + 1;
          }
        }
        local_1 = 1;
        local_74 = 1;
        std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::~vector
                  ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
                   in_stack_fffffffffffffe50);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_fffffffffffffe50);
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffffe50);
    }
    else {
      local_1 = 0;
      local_74 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                          size_t tmpBufSizeInBytes, size_t inLen, int num_channels,
                          const EXRChannelInfo *channels, int data_width,
                          int num_lines) {
  if (inLen == tmpBufSizeInBytes) {
    // Data is not compressed(Issue 40).
    memcpy(outPtr, inPtr, inLen);
    return true;
  }

  std::vector<unsigned char> bitmap(BITMAP_SIZE);
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !TINYEXR_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  memset(bitmap.data(), 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  // minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  tinyexr::cpy2(&minNonZero, reinterpret_cast<const unsigned short *>(ptr));
  // maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  tinyexr::cpy2(&maxNonZero, reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy(reinterpret_cast<char *>(&bitmap[0] + minNonZero), ptr,
           maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  std::vector<unsigned short> lut(USHORT_RANGE);
  memset(lut.data(), 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap.data(), lut.data());

  //
  // Huffman decoding
  //

  int length;

  // length = *(reinterpret_cast<const int *>(ptr));
  tinyexr::cpy4(&length, reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  if (size_t((ptr - inPtr) + length) > inLen) {
    return false;
  }

  std::vector<unsigned short> tmpBuffer(tmpBufSizeInBytes / sizeof(unsigned short));
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(static_cast<size_t>(num_channels));

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    size_t pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = static_cast<int>(pixelSize / sizeof(short));

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut.data(), &tmpBuffer.at(0), static_cast<int>(tmpBufSizeInBytes / sizeof(unsigned short)));

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      size_t n = static_cast<size_t>(cd.nx * cd.size);
      memcpy(outPtr, cd.end, static_cast<size_t>(n * sizeof(unsigned short)));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}